

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

void ipx::Transpose(SparseMatrix *A,SparseMatrix *AT)

{
  uint ncol;
  uint min_capacity;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint nrow;
  vector<int,_std::allocator<int>_> work;
  allocator_type local_51;
  size_type local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  ncol = A->nrow_;
  piVar2 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  min_capacity = piVar2[-1];
  nrow = (int)((ulong)((long)piVar2 -
                      (long)(A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) - 1;
  SparseMatrix::resize(AT,nrow,ncol,min_capacity);
  local_50 = (size_type)(int)ncol;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,local_50,&local_51);
  piVar2 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = (ulong)min_capacity;
  if ((int)min_capacity < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[piVar2[uVar7]] =
         local_48._M_impl.super__Vector_impl_data._M_start[piVar2[uVar7]] + 1;
  }
  piVar2 = (AT->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = (ulong)ncol;
  if ((int)ncol < 1) {
    uVar9 = uVar7;
  }
  iVar10 = 0;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    piVar2[uVar7] = iVar10;
    iVar1 = local_48._M_impl.super__Vector_impl_data._M_start[uVar7];
    local_48._M_impl.super__Vector_impl_data._M_start[uVar7] = iVar10;
    iVar10 = iVar1 + iVar10;
  }
  piVar2[local_50] = iVar10;
  piVar2 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = (ulong)nrow;
  if ((int)nrow < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    piVar3 = (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (AT->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (AT->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = (long)piVar2[uVar7]; lVar8 < piVar2[uVar7 + 1]; lVar8 = lVar8 + 1) {
      iVar10 = piVar3[lVar8];
      iVar1 = local_48._M_impl.super__Vector_impl_data._M_start[iVar10];
      local_48._M_impl.super__Vector_impl_data._M_start[iVar10] = iVar1 + 1;
      piVar5[iVar1] = (int)uVar7;
      pdVar6[iVar1] = pdVar4[lVar8];
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Transpose(const SparseMatrix& A, SparseMatrix& AT) {
    const Int m = A.rows();
    const Int n = A.cols();
    const Int nz = A.entries();
    AT.resize(n, m, nz);

    // Compute row counts of A in workspace.
    std::vector<Int> work(m);
    for (Int p = 0; p < nz; p++)
        work[A.index(p)]++;

    // Set column pointers for AT.
    Int* ATp = AT.colptr();
    Int sum = 0;
    for (Int i = 0; i < m; i++) {
        ATp[i] = sum;
        sum += work[i];
        work[i] = ATp[i];
    }
    assert(sum == nz);
    ATp[m] = sum;

    // Fill AT with one column of A at a time.
    // work[i] is the next free slot in column i of AT.
    for (Int j = 0; j < n; j++) {
        for (Int p = A.begin(j); p < A.end(j); p++) {
            Int put = work[A.index(p)]++;
            AT.index(put) = j;
            AT.value(put) = A.value(p);
        }
    }
}